

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O3

void mser_process(MserFilt *f,uchar *im)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uchar uVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  MserReg *pMVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  MserExtrReg *__ptr;
  uint *__ptr_00;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  MserExtrReg *pMVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  uint *puVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  float fVar42;
  long lVar43;
  long lVar44;
  undefined1 auVar45 [16];
  uint buckets [256];
  int local_4a4;
  uint local_438 [258];
  long lVar40;
  
  uVar7 = f->nel;
  uVar21 = (ulong)(int)uVar7;
  puVar33 = f->perm;
  puVar10 = f->joins;
  uVar36 = f->ndims;
  piVar11 = f->dims;
  piVar12 = f->subs;
  piVar13 = f->dsubs;
  piVar14 = f->strides;
  pMVar15 = f->r;
  __ptr = f->er;
  __ptr_00 = f->mer;
  iVar25 = f->delta;
  f->nell = 0;
  memset(local_438,0,0x400);
  uVar34 = 0;
  if (0 < (long)uVar21) {
    uVar22 = 0;
    do {
      local_438[im[uVar22]] = local_438[im[uVar22]] + 1;
      uVar22 = uVar22 + 1;
      uVar34 = local_438[0];
    } while (uVar21 != uVar22);
  }
  lVar23 = 1;
  do {
    uVar34 = uVar34 + local_438[lVar23];
    local_438[lVar23] = uVar34;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x100);
  uVar22 = uVar21;
  if (0 < (int)uVar7) {
    do {
      uVar34 = local_438[im[uVar22 - 1]];
      local_438[im[uVar22 - 1]] = uVar34 - 1;
      puVar33[uVar34 - 1] = (uint)(uVar22 - 1);
      auVar18 = _DAT_00110090;
      auVar17 = _DAT_00110080;
      bVar37 = 1 < uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar37);
    if (0 < (int)uVar7) {
      lVar23 = uVar21 - 1;
      auVar38._8_4_ = (int)lVar23;
      auVar38._0_8_ = lVar23;
      auVar38._12_4_ = (int)((ulong)lVar23 >> 0x20);
      lVar23 = 0;
      auVar38 = auVar38 ^ _DAT_00110080;
      auVar39 = _DAT_00110060;
      auVar41 = _DAT_00110070;
      do {
        auVar45 = auVar41 ^ auVar17;
        iVar20 = auVar38._4_4_;
        if ((bool)(~(auVar45._4_4_ == iVar20 && auVar38._0_4_ < auVar45._0_4_ ||
                    iVar20 < auVar45._4_4_) & 1)) {
          *(undefined4 *)((long)&pMVar15->parent + lVar23) = 0xffffffff;
        }
        if ((auVar45._12_4_ != auVar38._12_4_ || auVar45._8_4_ <= auVar38._8_4_) &&
            auVar45._12_4_ <= auVar38._12_4_) {
          *(undefined4 *)((long)&pMVar15[1].parent + lVar23) = 0xffffffff;
        }
        auVar45 = auVar39 ^ auVar17;
        iVar32 = auVar45._4_4_;
        if (iVar32 <= iVar20 && (iVar32 != iVar20 || auVar45._0_4_ <= auVar38._0_4_)) {
          *(undefined4 *)((long)&pMVar15[2].parent + lVar23) = 0xffffffff;
          *(undefined4 *)((long)&pMVar15[3].parent + lVar23) = 0xffffffff;
        }
        lVar40 = auVar41._8_8_;
        lVar43 = auVar18._0_8_;
        auVar41._0_8_ = auVar41._0_8_ + lVar43;
        lVar44 = auVar18._8_8_;
        auVar41._8_8_ = lVar40 + lVar44;
        lVar40 = auVar39._8_8_;
        auVar39._0_8_ = auVar39._0_8_ + lVar43;
        auVar39._8_8_ = lVar40 + lVar44;
        lVar23 = lVar23 + 0x40;
      } while ((ulong)(uVar7 + 3 >> 2) << 6 != lVar23);
      if (0 < (int)uVar7) {
        uVar22 = 0;
        local_4a4 = 0;
        iVar20 = 0;
LAB_00102db8:
        uVar34 = puVar33[uVar22];
        uVar5 = im[uVar34];
        pMVar15[uVar34].parent = uVar34;
        pMVar15[uVar34].shortcut = uVar34;
        pMVar15[uVar34].height = 1;
        pMVar15[uVar34].area = 1;
        uVar19 = uVar34;
        if (0 < (int)uVar36) {
          uVar26 = (ulong)uVar34;
          lVar23 = (ulong)uVar36 + 1;
          do {
            piVar13[lVar23 + -2] = -1;
            piVar12[lVar23 + -2] = (int)(uVar26 / (uint)piVar14[lVar23 + -2]);
            uVar26 = uVar26 % (ulong)(uint)piVar14[lVar23 + -2];
            lVar23 = lVar23 + -1;
          } while (1 < lVar23);
        }
        do {
          if ((int)uVar36 < 1) {
            bVar37 = true;
            uVar26 = 0;
          }
          else {
            uVar26 = 0;
            lVar23 = 1;
            do {
              iVar32 = piVar12[lVar23 + -1] + piVar13[lVar23 + -1];
              if (iVar32 < 0) goto LAB_00102fde;
              lVar40 = lVar23 + -1;
              bVar37 = iVar32 < piVar11[lVar40];
              uVar26 = (ulong)(uint)((int)uVar26 + piVar14[lVar23 + -1] * iVar32);
            } while ((lVar23 < (int)uVar36) && (lVar23 = lVar23 + 1, iVar32 < piVar11[lVar40]));
          }
          if ((bVar37) && (((uint)uVar26 != uVar34 && (pMVar15[uVar26].parent != 0xffffffff)))) {
            uVar8 = pMVar15[uVar19].height;
            uVar9 = pMVar15->height;
            uVar27 = uVar34;
            uVar30 = uVar34;
            do {
              uVar19 = uVar30;
              uVar30 = pMVar15[uVar19].shortcut;
              pMVar15[uVar19].shortcut = uVar27;
              uVar27 = uVar19;
            } while (uVar30 != uVar19);
            do {
              uVar30 = pMVar15[uVar27].shortcut;
              pMVar15[uVar27].shortcut = uVar19;
              bVar37 = uVar30 != uVar27;
              uVar35 = uVar26;
              uVar27 = uVar30;
            } while (bVar37);
            do {
              uVar31 = uVar35;
              uVar30 = pMVar15[uVar31].shortcut;
              pMVar15[uVar31].shortcut = (uint)uVar26;
              uVar27 = (uint)uVar31;
              uVar26 = uVar31;
              uVar35 = (ulong)uVar30;
            } while (uVar30 != uVar27);
            do {
              uVar24 = (uint)uVar26;
              uVar30 = pMVar15[uVar26].shortcut;
              pMVar15[uVar26].shortcut = uVar27;
              uVar26 = (ulong)uVar30;
            } while (uVar30 != uVar24);
            if (uVar19 != uVar27) {
              uVar6 = im[uVar31];
              lVar23 = (long)local_4a4;
              if ((uVar6 == uVar5) && ((int)uVar8 < (int)uVar9)) {
                pMVar15[uVar19].parent = uVar27;
                pMVar15[uVar19].shortcut = uVar27;
                pMVar15[uVar31].area = pMVar15[uVar31].area + pMVar15[uVar19].area;
                pMVar15[uVar31].height = uVar9;
                local_4a4 = local_4a4 + 1;
                puVar10[lVar23] = uVar19;
              }
              else {
                pMVar15[uVar31].parent = uVar19;
                pMVar15[uVar31].shortcut = uVar19;
                pMVar15[uVar19].area = pMVar15[uVar19].area + pMVar15[uVar31].area;
                uVar30 = uVar9 + 1;
                if ((int)(uVar9 + 1) < (int)uVar8) {
                  uVar30 = uVar8;
                }
                pMVar15[uVar19].height = uVar30;
                local_4a4 = local_4a4 + 1;
                puVar10[lVar23] = uVar27;
                iVar20 = iVar20 + (uint)(uVar6 != uVar5);
              }
            }
          }
LAB_00102fde:
          uVar26 = 0;
          while (iVar32 = piVar13[uVar26], piVar13[uVar26] = iVar32 + 1, 0 < iVar32) {
            piVar13[uVar26] = -1;
            uVar26 = uVar26 + 1;
            if (uVar36 == uVar26) {
              uVar22 = uVar22 + 1;
              if (uVar22 == uVar21) goto LAB_00103027;
              goto LAB_00102db8;
            }
          }
        } while( true );
      }
    }
  }
  iVar20 = 0;
  local_4a4 = 0;
LAB_00103027:
  iVar32 = iVar20 + 1;
  f->njoins = local_4a4;
  (f->stats).num_extremal = iVar32;
  if (f->rer <= iVar20) {
    if (__ptr != (MserExtrReg *)0x0) {
      free(__ptr);
    }
    __ptr = (MserExtrReg *)malloc((long)iVar32 * 0x1c);
    f->er = __ptr;
    f->rer = iVar32;
  }
  f->nmer = iVar32;
  iVar20 = 0;
  bVar37 = false;
  uVar22 = 0;
  uVar36 = 0;
  if (__ptr != (MserExtrReg *)0x0 && 0 < (int)uVar7) {
    uVar22 = 0;
    uVar36 = 0;
    do {
      uVar34 = puVar33[uVar22];
      if ((uVar34 == pMVar15[uVar34].parent) ||
         (uVar19 = 0xffffffff, im[uVar34] < im[pMVar15[uVar34].parent])) {
        __ptr[(int)uVar36].index = uVar34;
        __ptr[(int)uVar36].parent = uVar36;
        __ptr[(int)uVar36].value = im[uVar34];
        __ptr[(int)uVar36].area = pMVar15[uVar34].area;
        uVar19 = uVar36;
        uVar36 = uVar36 + 1;
      }
      pMVar15[uVar34].shortcut = uVar19;
      uVar22 = uVar22 + 1;
    } while (uVar21 != uVar22);
    uVar22 = (ulong)uVar36;
    bVar37 = 0 < (int)uVar36;
    if (0 < (int)uVar36) {
      uVar21 = 0;
      do {
        uVar26 = (ulong)(uint)__ptr[uVar21].index;
        do {
          uVar26 = (ulong)pMVar15[uVar26].parent;
        } while (pMVar15[uVar26].shortcut == 0xffffffff);
        __ptr[uVar21].parent = pMVar15[uVar26].shortcut;
        __ptr[uVar21].shortcut = (uint)uVar21;
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar22);
      if (0 < (int)uVar36) {
        uVar21 = 0;
        do {
          pMVar28 = __ptr + uVar21;
          uVar34 = __ptr[uVar21].shortcut;
          do {
            uVar19 = uVar34;
            uVar34 = __ptr[(int)uVar19].parent;
            if (uVar34 == uVar19) break;
          } while ((int)(uint)__ptr[(int)uVar34].value <= (int)((uint)__ptr[uVar21].value + iVar25))
          ;
          pMVar28->variation =
               (float)(int)(__ptr[(int)uVar19].area - pMVar28->area) / (float)(int)pMVar28->area;
          pMVar28->max_stable = 1;
          uVar34 = __ptr[pMVar28->parent].shortcut;
          if ((int)__ptr[pMVar28->parent].shortcut < (int)uVar19) {
            uVar34 = uVar19;
          }
          __ptr[pMVar28->parent].shortcut = uVar34;
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
        if ((int)uVar36 < 1) {
          bVar37 = false;
        }
        else {
          uVar21 = 0;
          pMVar28 = __ptr;
          do {
            uVar26 = (ulong)(uint)pMVar28->parent;
            if ((uint)__ptr[uVar26].value <= pMVar28->value + 1) {
              if (__ptr[uVar26].variation < pMVar28->variation ||
                  __ptr[uVar26].variation == pMVar28->variation) {
                uVar26 = uVar21 & 0xffffffff;
              }
              if (__ptr[uVar26].max_stable != 0) {
                uVar36 = uVar36 - 1;
                __ptr[uVar26].max_stable = 0;
              }
            }
            uVar21 = uVar21 + 1;
            pMVar28 = pMVar28 + 1;
          } while (uVar22 != uVar21);
        }
        goto LAB_001032ab;
      }
    }
    bVar37 = false;
  }
LAB_001032ab:
  (f->stats).num_unstable = (int)uVar22 - uVar36;
  if (bVar37) {
    fVar1 = f->max_area;
    fVar2 = f->min_area;
    fVar3 = f->max_variation;
    fVar4 = f->min_diversity;
    iVar25 = 0;
    iVar32 = 0;
    iVar29 = 0;
    iVar20 = 0;
    uVar21 = uVar22;
    do {
      if (__ptr[uVar21 - 1].max_stable == 0) goto LAB_00103351;
      pMVar28 = __ptr + -1 + uVar21;
      if (fVar3 <= pMVar28->variation) {
        iVar29 = iVar29 + 1;
LAB_00103346:
        pMVar28->max_stable = 0;
        uVar36 = uVar36 - 1;
      }
      else {
        fVar42 = (float)pMVar28->area;
        if (fVar1 * (float)uVar7 < fVar42) {
          iVar25 = iVar25 + 1;
          goto LAB_00103346;
        }
        if (fVar42 < (float)uVar7 * fVar2) {
          iVar32 = iVar32 + 1;
          goto LAB_00103346;
        }
        if ((fVar4 < 1.0) &&
           (uVar26 = (ulong)(uint)pMVar28->parent, uVar21 - 1 != (ulong)(uint)pMVar28->parent)) {
          do {
            uVar35 = uVar26;
            if (__ptr[uVar35].max_stable != 0) break;
            uVar26 = (ulong)(uint)__ptr[uVar35].parent;
          } while (__ptr[uVar35].parent != (uint)uVar35);
          if ((float)(int)(__ptr[uVar35].area - pMVar28->area) / (float)(int)__ptr[uVar35].area <
              fVar4) {
            iVar20 = iVar20 + 1;
            goto LAB_00103346;
          }
        }
      }
LAB_00103351:
      bVar16 = 1 < (long)uVar21;
      uVar21 = uVar21 - 1;
    } while (bVar16);
  }
  else {
    iVar29 = 0;
    iVar32 = 0;
    iVar25 = 0;
  }
  (f->stats).num_abs_unstable = iVar29;
  (f->stats).num_too_big = iVar25;
  (f->stats).num_too_small = iVar32;
  (f->stats).num_duplicates = iVar20;
  if (f->rmer < (int)uVar36) {
    if (__ptr_00 != (uint *)0x0) {
      free(__ptr_00);
    }
    __ptr_00 = (uint *)malloc((long)(int)uVar36 * 4);
    f->mer = __ptr_00;
    f->rmer = uVar36;
  }
  f->nmer = uVar36;
  if ((bool)((__ptr_00 != (uint *)0x0 && __ptr != (MserExtrReg *)0x0) & bVar37)) {
    puVar33 = &__ptr->max_stable;
    iVar25 = 0;
    do {
      if (*puVar33 != 0) {
        lVar23 = (long)iVar25;
        iVar25 = iVar25 + 1;
        __ptr_00[lVar23] = puVar33[-5];
      }
      puVar33 = puVar33 + 7;
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
  }
  return;
}

Assistant:

void
mser_process(MserFilt *f, unsigned char const *im) {
    /* shortcuts */
    unsigned int nel = f->nel;
    unsigned int *perm = f->perm;
    unsigned int *joins = f->joins;
    int ndims = f->ndims;
    int *dims = f->dims;
    int *subs = f->subs;
    int *dsubs = f->dsubs;
    int *strides = f->strides;
    MserReg *r = f->r;
    MserExtrReg *er = f->er;
    unsigned int *mer = f->mer;
    int delta = f->delta;

    int njoins = 0;
    int ner = 0;
    int nmer = 0;
    int nbig = 0;
    int nsmall = 0;
    int nbad = 0;
    int ndup = 0;

    int i, j, k;

    /* delete any previosuly computed ellipsoid */
    f->nell = 0;


    /* -----------------------------------------------------------------
    *                                          Sort pixels by intensity
    * -------------------------------------------------------------- */

    {
        unsigned int buckets[MSER_PIX_MAXVAL];

        /* clear buckets */
        memset(buckets, 0, sizeof(unsigned int) * MSER_PIX_MAXVAL);


        /* compute bucket size (how many pixels for each intensity
        * value) */
        for (i = 0; i < (int) nel; ++i) {
            unsigned char v = im[i];
            ++buckets[v];
        }

        /* cumulatively add bucket sizes */
        for (i = 1; i < MSER_PIX_MAXVAL; ++i) {
            buckets[i] += buckets[i - 1];
        }

        /* empty buckets computing pixel ordering */
        for (i = nel; i >= 1;) {
            unsigned char v = im[--i];
            unsigned int j = --buckets[v];
            perm[j] = i;
        }
    }

    /* initialize the forest with all void nodes */
    for (i = 0; i < (int) nel; ++i) {
        r[i].parent = MSER_VOID_NODE;
    }


    /* -----------------------------------------------------------------
    *                        Compute regions and count extremal regions
    * -------------------------------------------------------------- */


    /*
    * In the following:
    * idx    : index of the current pixel
    * val    : intensity of the current pixel
    * r_idx  : index of the root of the current pixel
    * n_idx  : index of the neighbors of the current pixel
    * nr_idx : index of the root of the neighbor of the current pixel
    */

    /* process each pixel by increasing intensity */
    for (i = 0; i < (int) nel; ++i) {
        /* pop next node xi */
        unsigned int idx = perm[i];
        unsigned char val = im[idx];
        unsigned int r_idx;

        /* add the pixel to the forest as a root for now */
        r[idx].parent = idx;
        r[idx].shortcut = idx;
        r[idx].area = 1;
        r[idx].height = 1;

        r_idx = idx;


        /* convert the index IDX into the subscript SUBS; also initialize
        * DSUBS to (-1,-1,...,-1) */
        {
            unsigned int temp = idx;
            for (k = ndims - 1; k >= 0; --k) {
                dsubs[k] = -1;
                subs[k] = temp / strides[k];
                temp = temp % strides[k];
            }
        }

        /* examine the neighbors of the current pixel */
        while (1) {
            unsigned int n_idx = 0;
            int good = 1;


            /*
            * Compute the neighbor subscript as NSUBS+SUB, the
            * corresponding neighbor index NINDEX and check that the
            * neighbor is within the image domain.
            */
            for (k = 0; k < ndims && good; ++k) {
                int temp = dsubs[k] + subs[k];
                good &= (0 <= temp) && (temp < dims[k]);
                n_idx += temp * strides[k];
            }


            /*
            * The neighbor should be processed if the following conditions
            * are met:
            * 1. The neighbor is within image boundaries.
            * 2. The neighbor is indeed different from the current node
            * (the opposite happens when DSUB=(0,0,...,0)).
            * 3. The neighbor is already in the forest, meaning that it has
            * already been processed.
            */
            if (good &&
                n_idx != idx &&
                r[n_idx].parent != MSER_VOID_NODE) {
                unsigned char nr_val = 0;
                unsigned int nr_idx = 0;
                int hgt = r[r_idx].height;
                int n_hgt = r[nr_idx].height;


                /*
                * Now we join the two subtrees rooted at
                * R_IDX = ROOT(  IDX)
                * NR_IDX = ROOT(N_IDX).
                * Note that R_IDX = ROOT(IDX) might change as we process more
                * neighbors, so we need keep updating it.
                */

                r_idx = climb(r, idx);
                nr_idx = climb(r, n_idx);


                /*
                * At this point we have three possibilities:
                * (A) ROOT(IDX) == ROOT(NR_IDX). In this case the two trees
                * have already been joined and we do not do anything.
                * (B) I(ROOT(IDX)) == I(ROOT(NR_IDX)). In this case the pixel
                * IDX is extending an extremal region with the same
                * intensity value. Since ROOT(NR_IDX) will NOT be an
                * extremal region of the full image, ROOT(IDX) can be
                * safely added as children of ROOT(NR_IDX) if this
                * reduces the height according to the union rank
                * heuristic.
                * (C) I(ROOT(IDX)) > I(ROOT(NR_IDX)). In this case the pixel
                * IDX is starting a new extremal region. Thus ROOT(NR_IDX)
                * WILL be an extremal region of the final image and the
                * only possibility is to add ROOT(NR_IDX) as children of
                * ROOT(IDX), which becomes parent.
                */

                if (r_idx != nr_idx) /* skip if (A) */

                {
                    nr_val = im[nr_idx];

                    if (nr_val == val && hgt < n_hgt) {
                        /* ROOT(IDX) becomes the child */
                        r[r_idx].parent = nr_idx;
                        r[r_idx].shortcut = nr_idx;
                        r[nr_idx].area += r[r_idx].area;
                        r[nr_idx].height = MAX(n_hgt, hgt + 1);

                        joins[njoins++] = r_idx;
                    } else {
                        /* cases ROOT(IDX) becomes the parent */
                        r[nr_idx].parent = r_idx;
                        r[nr_idx].shortcut = r_idx;
                        r[r_idx].area += r[nr_idx].area;
                        r[r_idx].height = MAX(hgt, n_hgt + 1);

                        joins[njoins++] = nr_idx;

                        /* count if extremal */
                        if (nr_val != val)
                            ++ner;
                    }       /* check b vs c */
                }               /* check a vs b or c */
            }                       /* neighbor done */

            /* move to next neighbor */
            k = 0;
            while (++dsubs[k] > 1) {
                dsubs[k++] = -1;
                if (k == ndims)
                    goto done_all_neighbors;
            }
        } /* next neighbor */
        done_all_neighbors:;
    }        /* next pixel */

    /* the last root is extremal too */
    ++ner;

    /* save back */
    f->njoins = njoins;

    f->stats.num_extremal = ner;


    /* -----------------------------------------------------------------
    *                                          Extract extremal regions
    * -------------------------------------------------------------- */


    /*
    * Extremal regions are extracted and stored into the array ER.  The
    * structure R is also updated so that .SHORTCUT indexes the
    * corresponding extremal region if any (otherwise it is set to
    * VOID).
    */

    /* make room */
    if (f->rer < ner) {
        if (er)
            free(er);
        f->er = er = (MserExtrReg *) malloc(sizeof(MserExtrReg) * ner);
        f->rer = ner;
    };

    /* save back */
    f->nmer = ner;

    /* count again */
    ner = 0;

    /* scan all regions Xi */
    if (er != NULL) {
        for (i = 0; i < (int) nel; ++i) {
            /* pop next node xi */
            unsigned int idx = perm[i];

            unsigned char val = im[idx];
            unsigned int p_idx = r[idx].parent;
            unsigned char p_val = im[p_idx];

            /* is extremal ? */
            int is_extr = (p_val > val) || idx == p_idx;

            if (is_extr) {
                /* if so, add it */
                er[ner].index = idx;
                er[ner].parent = ner;
                er[ner].value = im[idx];
                er[ner].area = r[idx].area;

                /* link this region to this extremal region */
                r[idx].shortcut = ner;

                /* increase count */
                ++ner;
            } else {
                /* link this region to void */
                r[idx].shortcut = MSER_VOID_NODE;
            }
        }
    }


    /* -----------------------------------------------------------------
    *                                   Link extremal regions in a tree
    * -------------------------------------------------------------- */

    for (i = 0; i < ner; ++i) {
        unsigned int idx = er[i].index;

        do {
            idx = r[idx].parent;
        } while (r[idx].shortcut == MSER_VOID_NODE);

        er[i].parent = r[idx].shortcut;
        er[i].shortcut = i;
    }


    /* -----------------------------------------------------------------
    *                            Compute variability of +DELTA branches
    * -------------------------------------------------------------- */


    /* For each extremal region Xi of value VAL we look for the biggest
    * parent that has value not greater than VAL+DELTA. This is dubbed
    * `top parent'. */

    for (i = 0; i < ner; ++i) {
        /* Xj is the current region the region and Xj are the parents */
        int top_val = er[i].value + delta;
        int top = er[i].shortcut;

        /* examine all parents */
        while (1) {
            int next = er[top].parent;
            int next_val = er[next].value;


            /* Break if:
            * - there is no node above the top or
            * - the next node is above the top value.
            */
            if (next == top || next_val > top_val)
                break;

            /* so next could be the top */
            top = next;
        }

        /* calculate branch variation */
        {
            int area = er[i].area;
            int area_top = er[top].area;
            er[i].variation = (float) (area_top - area) / area;
            er[i].max_stable = 1;
        }


        /* Optimization: since extremal regions are processed by
        * increasing intensity, all next extremal regions being processed
        * have value at least equal to the one of Xi. If any of them has
        * parent the parent of Xi (this comprises the parent itself), we
        * can safely skip most intermediate node along the branch and
        * skip directly to the top to start our search. */
        {
            int parent = er[i].parent;
            int curr = er[parent].shortcut;
            er[parent].shortcut = MAX(top, curr);
        }
    }


    /* -----------------------------------------------------------------
    *                                  Select maximally stable branches
    * -------------------------------------------------------------- */

    nmer = ner;
    for (i = 0; i < ner; ++i) {
        unsigned int parent = er[i].parent;
        unsigned char val = er[i].value;
        float var = er[i].variation;
        unsigned char p_val = er[parent].value;
        float p_var = er[parent].variation;
        unsigned int loser;


        /*
        * Notice that R_parent = R_{l+1} only if p_val = val + 1. If not,
        * this and the parent region coincide and there is nothing to do.
        */
        if (p_val > val + 1)
            continue;

        /* decide which one to keep and put that in loser */
        if (var < p_var)
            loser = parent;
        else loser = i;

        /* make loser NON maximally stable */
        if (er[loser].max_stable) {
            --nmer;
            er[loser].max_stable = 0;
        }
    }

    f->stats.num_unstable = ner - nmer;


    /* -----------------------------------------------------------------
    *                                                 Further filtering
    * -------------------------------------------------------------- */


    /* It is critical for correct duplicate detection to remove regions
    * from the bottom (smallest one first).                          */
    {
        float max_area = (float) f->max_area * nel;
        float min_area = (float) f->min_area * nel;
        float max_var = (float) f->max_variation;
        float min_div = (float) f->min_diversity;

        /* scan all extremal regions (intensity value order) */
        for (i = ner - 1; i >= 0L; --i) {
            /* process only maximally stable extremal regions */
            if (!er[i].max_stable)
                continue;

            if (er[i].variation >= max_var) {
                ++nbad;
                goto remove;
            }
            if (er[i].area > max_area) {
                ++nbig;
                goto remove;
            }
            if (er[i].area < min_area) {
                ++nsmall;
                goto remove;
            }


            /*
            * Remove duplicates
            */
            if (min_div < 1.0) {
                unsigned int parent = er[i].parent;
                int area, p_area;
                float div;

                /* check all but the root mser */
                if ((int) parent != i) {
                    /* search for the maximally stable parent region */
                    while (!er[parent].max_stable) {
                        unsigned int next = er[parent].parent;
                        if (next == parent)
                            break;
                        parent = next;
                    }


                    /* Compare with the parent region; if the current and parent
                    * regions are too similar, keep only the parent. */
                    area = er[i].area;
                    p_area = er[parent].area;
                    div = (float) (p_area - area) / (float) p_area;

                    if (div < min_div) {
                        ++ndup;
                        goto remove;
                    }
                } /* remove dups end */
            }
            continue;
            remove:
            er[i].max_stable = 0;
            --nmer;
        }         /* check next region */

        f->stats.num_abs_unstable = nbad;
        f->stats.num_too_big = nbig;
        f->stats.num_too_small = nsmall;
        f->stats.num_duplicates = ndup;
    }


    /* -----------------------------------------------------------------
    *                                                   Save the result
    * -------------------------------------------------------------- */

    /* make room */
    if (f->rmer < nmer) {
        if (mer)
            free(mer);
        f->mer = mer = (unsigned int *) malloc(sizeof(unsigned int) * nmer);
        f->rmer = nmer;
    }

    /* save back */
    f->nmer = nmer;

    j = 0;
    if (er != NULL && mer != NULL) {
        for (i = 0; i < ner; ++i) {
            if (er[i].max_stable)
                mer[j++] = er[i].index;
        }
    }
}